

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_alstea_ehrlouge(CHAR_DATA *mob)

{
  int iVar1;
  ROOM_INDEX_DATA *arg1;
  CHAR_DATA *in_RDI;
  int rnd;
  char *unaff_retaddr;
  ROOM_INDEX_DATA *study;
  undefined4 in_stack_ffffffffffffffe8;
  
  arg1 = get_room_index((int)((ulong)in_RDI >> 0x20));
  if (((in_RDI->fighting == (CHAR_DATA *)0x0) && (in_RDI->position < 6)) &&
     (in_RDI->in_room->vnum == 0x69)) {
    iVar1 = number_percent();
    if (iVar1 < 4) {
      act(unaff_retaddr,in_RDI,arg1,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
    }
    else if (0x61 < iVar1) {
      act(unaff_retaddr,in_RDI,arg1,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
    }
  }
  return;
}

Assistant:

void pulse_prog_alstea_ehrlouge(CHAR_DATA *mob)
{
	ROOM_INDEX_DATA *study = get_room_index(105);

	if (mob->fighting || mob->position > POS_RESTING)
		return;

	if (mob->in_room->vnum != 105)
		return;

	int rnd = number_percent();

	if (rnd < 4)
	{
		act("Ehrlouge scribbles something down violently, his teeth gritting and chattering.", mob, 0, 0, TO_ROOM);
		return;
	}

	if (rnd > 97)
	{
		act("The skeletal figure of Ehrlouge begins to shudder and tremble as he dryly and raspily whimpers.", mob, 0, 0, TO_ROOM);
		return;
	}
}